

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# probe.c
# Opt level: O1

void genDotSurface(atom *allMainAtoms,atomBins *abins,atom *allMovingAtoms,atomBins *bbins,
                  pointSet *dots,float probeRad,float spikelen,int srcFlag,dotNode *(*results) [7])

{
  atomBins *abins_00;
  int iVar1;
  atom *paVar2;
  int dummy;
  int local_44;
  atomBins *local_40;
  pointSet *local_38;
  
  local_44 = 1;
  local_40 = bbins;
  local_38 = dots;
  if (allMainAtoms != (atom *)0x0) {
    do {
      if ((allMainAtoms->flags & srcFlag) != 0) {
        paVar2 = findTouchingAtoms(allMainAtoms,(atom *)0x0,abins,probeRad,0,&local_44);
        if (bbins != (atomBins *)0x0 && allMovingAtoms != (atom *)0x0) {
          paVar2 = findTouchingAtoms(allMainAtoms,paVar2,local_40,probeRad,0,&local_44);
        }
        if (paVar2 != (atom *)0x0) {
          markBonds(allMainAtoms,paVar2,1,1);
        }
        iVar1 = dotType(allMainAtoms,paVar2,0);
        surfDots(allMainAtoms,iVar1,paVar2,local_38,probeRad,spikelen,results);
        if ((Verbose == '\0') && ((ShowTicks & 1) == 0)) {
          genDotSurface_cold_1();
        }
      }
      allMainAtoms = allMainAtoms->next;
    } while (allMainAtoms != (atom_t *)0x0);
  }
  abins_00 = local_40;
  if (bbins != (atomBins *)0x0 && allMovingAtoms != (atom *)0x0) {
    do {
      if ((allMovingAtoms->flags & srcFlag) != 0) {
        paVar2 = findTouchingAtoms(allMovingAtoms,(atom *)0x0,abins,probeRad,0,&local_44);
        paVar2 = findTouchingAtoms(allMovingAtoms,paVar2,abins_00,probeRad,0,&local_44);
        if (paVar2 != (atom *)0x0) {
          markBonds(allMovingAtoms,paVar2,1,1);
        }
        iVar1 = dotType(allMovingAtoms,paVar2,0);
        surfDots(allMovingAtoms,iVar1,paVar2,local_38,probeRad,spikelen,results);
        if ((Verbose == '\0') && ((ShowTicks & 1) == 0)) {
          genDotSurface_cold_2();
        }
      }
      allMovingAtoms = allMovingAtoms->next;
    } while (allMovingAtoms != (atom_t *)0x0);
  }
  return;
}

Assistant:

void genDotSurface(atom *allMainAtoms, atomBins *abins,
			atom *allMovingAtoms, atomBins *bbins,
			pointSet dots[],
			float probeRad, float spikelen, int srcFlag,
			dotNode *results[][NODEWIDTH])
{
   atom *src = NULL, *atomList = NULL, *atomList2 = NULL;
   int type = 0, usesMovingAtoms = FALSE;
   int dummy = TRUE;

   usesMovingAtoms = ((allMovingAtoms != NULL) && (bbins != NULL));

   for(src = allMainAtoms; src; src = src->next) {
      if (src->flags & srcFlag) {

	 atomList  = findTouchingAtoms(src, NULL,     abins, probeRad, 0, &dummy);
	 if (usesMovingAtoms) {
	    atomList2 = findTouchingAtoms(src, atomList, bbins, probeRad, 0, &dummy);
	 }
	 else { atomList2 = atomList; }

	 if (atomList2) {
	    markBonds(src, atomList2, 1, 1); /*in genDotSurface()*/
	 }

	 type = dotType(src, atomList2, FALSE);

	 surfDots(src, type, atomList2, dots,
		     probeRad, spikelen, results);

	 if(Verbose && ShowTicks) {
	    fprintf(stderr, "%s%d   \r",
			src->r->resname, src->r->resid);
	 }
      }
   }

   if (usesMovingAtoms) {
      for(src = allMovingAtoms; src; src = src->next) {
	 if (src->flags & srcFlag) {

	    atomList  = findTouchingAtoms(src, NULL,     abins, probeRad, 0, &dummy);
	    atomList2 = findTouchingAtoms(src, atomList, bbins, probeRad, 0, &dummy);
	    if (atomList2) {
	       markBonds(src, atomList2, 1, 1); /*in genDotSurface()*/
	    }

	    type = dotType(src, atomList2, FALSE);

	    surfDots(src, type, atomList2, dots,
		     probeRad, spikelen, results);

	    if(Verbose && ShowTicks) {
	       fprintf(stderr, "%s%d   \r",
			src->r->resname, src->r->resid);
	    }
	 }
      }
   }
}